

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ArrayAllocate(sqlite3 *db,void *pArray,int szEntry,int *pnEntry,int *pIdx)

{
  int iVar1;
  ulong uVar2;
  int *in_RCX;
  int in_EDX;
  void *in_RSI;
  int *in_R8;
  void *pNew;
  sqlite3_int64 sz;
  sqlite3_int64 n;
  char *z;
  sqlite3 *db_00;
  void *in_stack_ffffffffffffffb0;
  void *local_18;
  
  iVar1 = *in_RCX;
  *in_R8 = iVar1;
  uVar2 = (ulong)iVar1;
  local_18 = in_RSI;
  if ((uVar2 & uVar2 - 1) == 0) {
    if (uVar2 == 0) {
      db_00 = (sqlite3 *)&DAT_00000001;
    }
    else {
      db_00 = (sqlite3 *)(uVar2 << 1);
    }
    local_18 = sqlite3DbRealloc(db_00,in_stack_ffffffffffffffb0,(u64)db_00);
    if (local_18 == (void *)0x0) {
      *in_R8 = -1;
      return in_RSI;
    }
  }
  memset((void *)((long)local_18 + uVar2 * (long)in_EDX),0,(long)in_EDX);
  *in_RCX = *in_RCX + 1;
  return local_18;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ArrayAllocate(
  sqlite3 *db,      /* Connection to notify of malloc failures */
  void *pArray,     /* Array of objects.  Might be reallocated */
  int szEntry,      /* Size of each object in the array */
  int *pnEntry,     /* Number of objects currently in use */
  int *pIdx         /* Write the index of a new slot here */
){
  char *z;
  sqlite3_int64 n = *pIdx = *pnEntry;
  if( (n & (n-1))==0 ){
    sqlite3_int64 sz = (n==0) ? 1 : 2*n;
    void *pNew = sqlite3DbRealloc(db, pArray, sz*szEntry);
    if( pNew==0 ){
      *pIdx = -1;
      return pArray;
    }
    pArray = pNew;
  }
  z = (char*)pArray;
  memset(&z[n * szEntry], 0, szEntry);
  ++*pnEntry;
  return pArray;
}